

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Timing.cpp
# Opt level: O0

void __thiscall soul::ScopedTimer::~ScopedTimer(ScopedTimer *this)

{
  bool bVar1;
  double __x;
  anon_class_8_1_8991fb9c local_58;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_50;
  string local_30 [32];
  ScopedTimer *local_10;
  ScopedTimer *this_local;
  
  local_10 = this;
  bVar1 = Logger::isLoggingEnabled();
  if (bVar1) {
    std::__cxx11::string::string(local_30,(string *)this);
    local_58.this = this;
    std::function<std::__cxx11::string()>::function<soul::ScopedTimer::~ScopedTimer()::__0,void>
              ((function<std::__cxx11::string()> *)&local_50,&local_58);
    Logger::log((Logger *)local_30,__x);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    ~function(&local_50);
    std::__cxx11::string::~string(local_30);
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

ScopedTimer::~ScopedTimer()
{
    SOUL_LOG (description, [&] { return getElapsedTimeDescription(); });
}